

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O0

void __thiscall
r_exec::TimingGuardBuilder::write_guard
          (TimingGuardBuilder *this,Code *mdl,uint16_t l,uint16_t r,uint16_t opcode,uint64_t offset,
          uint16_t *write_index,uint16_t *extent_index)

{
  uint16_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Atom local_48 [4];
  Atom local_44 [4];
  Atom local_40 [20];
  Atom local_2c [4];
  uint64_t local_28;
  uint64_t offset_local;
  uint16_t opcode_local;
  uint16_t r_local;
  Code *pCStack_18;
  uint16_t l_local;
  Code *mdl_local;
  TimingGuardBuilder *this_local;
  
  *extent_index = *extent_index + 1;
  local_28 = offset;
  offset_local._2_2_ = opcode;
  offset_local._4_2_ = r;
  offset_local._6_2_ = l;
  pCStack_18 = mdl;
  mdl_local = (Code *)this;
  r_code::Atom::AssignmentPointer((uchar)local_2c,l & 0xff);
  uVar1 = *write_index;
  *write_index = uVar1 + 1;
  iVar2 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)(ushort)(uVar1 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar2),local_2c);
  r_code::Atom::~Atom(local_2c);
  r_code::Atom::Operator((ushort)local_40,(uchar)offset_local._2_2_);
  iVar2 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)*extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar2),local_40);
  r_code::Atom::~Atom(local_40);
  r_code::Atom::VLPointer((ushort)local_44,offset_local._4_2_);
  uVar1 = *extent_index;
  *extent_index = uVar1 + 1;
  iVar2 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)(ushort)(uVar1 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar2),local_44);
  r_code::Atom::~Atom(local_44);
  *extent_index = *extent_index + 1;
  r_code::Atom::IPointer((ushort)local_48);
  iVar2 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)*extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar2),local_48);
  r_code::Atom::~Atom(local_48);
  uVar1 = *extent_index;
  *extent_index = uVar1 + 1;
  r_code::Utils::SetTimestamp(pCStack_18,uVar1 + 1,local_28);
  *extent_index = *extent_index + 2;
  return;
}

Assistant:

void TimingGuardBuilder::write_guard(Code *mdl, uint16_t l, uint16_t r, uint16_t opcode, uint64_t offset, uint16_t &write_index, uint16_t &extent_index) const
{
    mdl->code(++write_index) = Atom::AssignmentPointer(l, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(opcode, 2); // l:(opcode r offset)
    mdl->code(++extent_index) = Atom::VLPointer(r);
    extent_index++;
    mdl->code(extent_index) = Atom::IPointer(extent_index + 1);
    Utils::SetTimestamp(mdl, ++extent_index, offset);
    extent_index += 2;
}